

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O0

void __thiscall net_uv::KCPServer::onNewConnect(KCPServer *this,Socket *socket)

{
  IUINT32 sessionId;
  KCPSession *pKVar1;
  KCPServer *local_d0;
  code *local_c8;
  undefined8 local_c0;
  type local_b8;
  SessionCloseCall local_a0;
  KCPServer *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  SessionRecvCall local_40;
  KCPSession *local_20;
  KCPSession *session;
  Socket *socket_local;
  KCPServer *this_local;
  
  session = (KCPSession *)socket;
  socket_local = (Socket *)this;
  if (socket == (Socket *)0x0) {
    net_uvLog(3,"Failed to accept new connection");
  }
  else {
    pKVar1 = KCPSession::createSession
                       (&(this->super_Server).super_SessionManager,(KCPSocket *)socket);
    local_20 = pKVar1;
    if (pKVar1 == (KCPSession *)0x0) {
      net_uvLog(3,"The server failed to create a new session.");
    }
    else {
      local_68 = onSessionRecvData;
      local_60 = 0;
      local_70 = this;
      std::
      bind<void(net_uv::KCPServer::*)(net_uv::Session*,char*,unsigned_int),net_uv::KCPServer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
                (&local_58,(offset_in_KCPServer_to_subr *)&local_68,&local_70,
                 (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2
                 ,(_Placeholder<3> *)&std::placeholders::_3);
      std::function<void(net_uv::Session*,char*,unsigned_int)>::
      function<std::_Bind<void(net_uv::KCPServer::*(net_uv::KCPServer*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(net_uv::Session*,char*,unsigned_int)>,void>
                ((function<void(net_uv::Session*,char*,unsigned_int)> *)&local_40,&local_58);
      Session::setSessionRecvCallback(&pKVar1->super_Session,&local_40);
      std::function<void_(net_uv::Session_*,_char_*,_unsigned_int)>::~function(&local_40);
      pKVar1 = local_20;
      local_c8 = onSessionClose;
      local_c0 = 0;
      local_d0 = this;
      std::
      bind<void(net_uv::KCPServer::*)(net_uv::Session*),net_uv::KCPServer*,std::_Placeholder<1>const&>
                (&local_b8,(offset_in_KCPServer_to_subr *)&local_c8,&local_d0,
                 (_Placeholder<1> *)&std::placeholders::_1);
      std::function<void(net_uv::Session*)>::
      function<std::_Bind<void(net_uv::KCPServer::*(net_uv::KCPServer*,std::_Placeholder<1>))(net_uv::Session*)>,void>
                ((function<void(net_uv::Session*)> *)&local_a0,&local_b8);
      Session::setSessionClose(&pKVar1->super_Session,&local_a0);
      std::function<void_(net_uv::Session_*)>::~function(&local_a0);
      pKVar1 = local_20;
      sessionId = KCPSocket::getConv((KCPSocket *)session);
      Session::setSessionID(&pKVar1->super_Session,sessionId);
      (*(local_20->super_Session)._vptr_Session[0xb])(local_20,1);
      addNewSession(this,local_20);
    }
  }
  return;
}

Assistant:

void KCPServer::onNewConnect(Socket* socket)
{
	if (socket != NULL)
	{
		KCPSession* session = KCPSession::createSession(this, (KCPSocket*)socket);
		if (session == NULL)
		{
			NET_UV_LOG(NET_UV_L_ERROR, "The server failed to create a new session.");
		}
		else
		{
			session->setSessionRecvCallback(std::bind(&KCPServer::onSessionRecvData, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
			session->setSessionClose(std::bind(&KCPServer::onSessionClose, this, std::placeholders::_1));
			session->setSessionID(((KCPSocket*)socket)->getConv());
			session->setIsOnline(true);
			addNewSession(session);
		}
	}
	else
	{
		NET_UV_LOG(NET_UV_L_ERROR, "Failed to accept new connection");
	}
}